

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureFilteringTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles31::Functional::TextureCubeArrayFilteringCase::iterate
          (TextureCubeArrayFilteringCase *this)

{
  float *pfVar1;
  pointer pfVar2;
  int *piVar3;
  ostringstream *poVar4;
  ostringstream *this_00;
  deUint32 dVar5;
  TestLog *log;
  pointer pFVar6;
  int y;
  bool bVar7;
  int i;
  int iVar8;
  deUint32 dVar9;
  uint uVar10;
  SamplerType SVar11;
  CubeFace face;
  undefined4 extraout_var;
  RenderTarget *renderTarget;
  undefined8 *puVar12;
  size_t sVar13;
  undefined4 extraout_var_00;
  NotSupportedError *this_01;
  char *pcVar14;
  uint uVar15;
  ulong uVar16;
  qpTestResult testResult;
  ulong uVar17;
  TestContext *pTVar18;
  void *pvVar19;
  long lVar20;
  pointer pFVar21;
  vector<float,_std::allocator<float>_> texCoord;
  Surface result;
  TextureCubeArrayView local_3a8;
  RandomViewport viewport;
  LookupPrecision local_378;
  PixelFormat pixelFormat;
  ulong local_338 [2];
  TestLog *local_328;
  float local_31c;
  float local_318;
  float local_314;
  float local_310;
  LodPrecision lodPrecision;
  IVec4 coordBits;
  ulong local_2f0 [2];
  RenderContext *local_2e0;
  long local_2d8;
  ScopedLogSection section;
  TextureFormat texFmt;
  ReferenceParams refParams;
  IVec4 colorBits;
  Vector<int,_4> res;
  undefined8 uStack_1c4;
  ios_base local_188 [8];
  ios_base local_180 [272];
  TextureFormatInfo fmtInfo;
  
  local_328 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_2e0 = ((this->super_TestCase).m_context)->m_renderCtx;
  iVar8 = (*local_2e0->_vptr_RenderContext[3])();
  lVar20 = CONCAT44(extraout_var,iVar8);
  dVar9 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p)
  ;
  uVar10 = ((uint)this->m_caseNdx >> 0x10 ^ this->m_caseNdx ^ 0x3d) * 9;
  uVar15 = (uVar10 >> 4 ^ uVar10) * 0x27d4eb2d;
  uVar10 = tcu::CommandLine::getBaseSeed
                     (((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_cmdLine);
  renderTarget = Context::getRenderTarget((this->super_TestCase).m_context);
  gls::TextureTestUtil::RandomViewport::RandomViewport
            (&viewport,renderTarget,0x1c,0x1c,dVar9 ^ uVar10 ^ uVar15 ^ uVar15 >> 0xf);
  iVar8 = this->m_caseNdx;
  pFVar21 = (this->m_cases).
            super__Vector_base<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase,_std::allocator<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase>_>
            ._M_impl.super__Vector_impl_data._M_start;
  texFmt = ((pFVar21[iVar8].texture)->m_refTexture).super_TextureLevelPyramid.m_format;
  tcu::getTextureFormatInfo(&fmtInfo,&texFmt);
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  piVar3 = local_378.uvwBits.m_data + 1;
  local_378.coordBits.m_data._0_8_ = piVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_378,"Test","");
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&res);
  std::ostream::operator<<(&res,this->m_caseNdx);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&res);
  std::ios_base::~ios_base(local_188);
  uVar16 = (long)result.m_pixels.m_ptr +
           CONCAT44(local_378.uvwBits.m_data[0],local_378.coordBits.m_data[2]);
  uVar17 = 0xf;
  if ((int *)local_378.coordBits.m_data._0_8_ != piVar3) {
    uVar17 = CONCAT44(local_378.uvwBits.m_data[2],local_378.uvwBits.m_data[1]);
  }
  if (uVar17 < uVar16) {
    uVar17 = 0xf;
    if ((size_t *)CONCAT44(result.m_height,result.m_width) != &result.m_pixels.m_cap) {
      uVar17 = result.m_pixels.m_cap;
    }
    if (uVar17 < uVar16) goto LAB_004aa82e;
    puVar12 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&result,0,(char *)0x0,local_378.coordBits.m_data._0_8_);
  }
  else {
LAB_004aa82e:
    puVar12 = (undefined8 *)
              std::__cxx11::string::_M_append
                        ((char *)&local_378,CONCAT44(result.m_height,result.m_width));
  }
  refParams.super_RenderParams._0_8_ = refParams.super_RenderParams.w.m_data + 1;
  pfVar1 = (float *)(puVar12 + 2);
  if ((float *)*puVar12 == pfVar1) {
    refParams.super_RenderParams.w.m_data._4_8_ = *(undefined8 *)pfVar1;
    refParams.super_RenderParams.w.m_data[3] = *(float *)(puVar12 + 3);
    refParams.super_RenderParams.bias = *(float *)((long)puVar12 + 0x1c);
  }
  else {
    refParams.super_RenderParams.w.m_data._4_8_ = *(undefined8 *)pfVar1;
    refParams.super_RenderParams._0_8_ = (float *)*puVar12;
  }
  refParams.super_RenderParams._8_8_ = puVar12[1];
  *puVar12 = pfVar1;
  puVar12[1] = 0;
  *(undefined1 *)pfVar1 = 0;
  pixelFormat._0_8_ = local_338;
  std::__cxx11::string::_M_construct<char_const*>((string *)&pixelFormat,"Test ","");
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&res);
  std::ostream::operator<<(&res,this->m_caseNdx);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&res);
  std::ios_base::~ios_base(local_188);
  uVar16 = CONCAT44(coordBits.m_data[3],coordBits.m_data[2]) + pixelFormat._8_8_;
  uVar17 = 0xf;
  if ((ulong *)pixelFormat._0_8_ != local_338) {
    uVar17 = local_338[0];
  }
  if (uVar17 < uVar16) {
    uVar17 = 0xf;
    if ((ulong *)coordBits.m_data._0_8_ != local_2f0) {
      uVar17 = local_2f0[0];
    }
    if (uVar16 <= uVar17) {
      puVar12 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&coordBits,0,(char *)0x0,pixelFormat._0_8_);
      goto LAB_004aa99f;
    }
  }
  puVar12 = (undefined8 *)
            std::__cxx11::string::_M_append((char *)&pixelFormat,coordBits.m_data._0_8_);
LAB_004aa99f:
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
  pfVar2 = (pointer)(puVar12 + 2);
  if ((pointer)*puVar12 == pfVar2) {
    texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = *(pointer *)pfVar2;
  }
  else {
    texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = *(pointer *)pfVar2;
    texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)*puVar12;
  }
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)puVar12[1];
  *puVar12 = pfVar2;
  puVar12[1] = 0;
  *(undefined1 *)pfVar2 = 0;
  tcu::ScopedLogSection::ScopedLogSection(&section,log,(string *)&refParams,(string *)&texCoord);
  if ((pointer *)
      texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      &texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage) {
    operator_delete(texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage + 1);
  }
  if ((ulong *)coordBits.m_data._0_8_ != local_2f0) {
    operator_delete((void *)coordBits.m_data._0_8_,local_2f0[0] + 1);
  }
  if ((ulong *)pixelFormat._0_8_ != local_338) {
    operator_delete((void *)pixelFormat._0_8_,local_338[0] + 1);
  }
  if ((float *)refParams.super_RenderParams._0_8_ != refParams.super_RenderParams.w.m_data + 1) {
    operator_delete((void *)refParams.super_RenderParams._0_8_,
                    refParams.super_RenderParams.w.m_data._4_8_ + 1);
  }
  if ((size_t *)CONCAT44(result.m_height,result.m_width) != &result.m_pixels.m_cap) {
    operator_delete((undefined1 *)CONCAT44(result.m_height,result.m_width),result.m_pixels.m_cap + 1
                   );
  }
  if ((int *)local_378.coordBits.m_data._0_8_ != piVar3) {
    operator_delete((void *)local_378.coordBits.m_data._0_8_,
                    CONCAT44(local_378.uvwBits.m_data[2],local_378.uvwBits.m_data[1]) + 1);
  }
  glu::TextureTestUtil::ReferenceParams::ReferenceParams(&refParams,TEXTURETYPE_CUBE_ARRAY);
  if ((viewport.width < 0x1c) || (viewport.height < 0x1c)) {
    this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_01,"Render target too small",SSBOArrayLengthTests::init::arraysSized + 1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureFilteringTests.cpp"
               ,0x150);
    __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  glu::mapGLSampler((Sampler *)&res,0x812f,0x812f,this->m_minFilter,this->m_magFilter);
  refParams.sampler.wrapS = res.m_data[0];
  refParams.sampler.wrapT = res.m_data[1];
  refParams.sampler.wrapR = res.m_data[2];
  refParams.sampler.minFilter = res.m_data[3];
  refParams.sampler._53_7_ = SUB87(uStack_1c4,1);
  refParams.sampler.seamlessCubeMap = true;
  SVar11 = glu::TextureTestUtil::getSamplerType(texFmt);
  pFVar21 = pFVar21 + iVar8;
  refParams.super_RenderParams.samplerType = SVar11;
  refParams.super_RenderParams.colorBias.m_data[0] = fmtInfo.lookupBias.m_data[0];
  refParams.super_RenderParams.colorBias.m_data[1] = fmtInfo.lookupBias.m_data[1];
  refParams.super_RenderParams.colorBias.m_data[2] = fmtInfo.lookupBias.m_data[2];
  refParams.super_RenderParams.colorBias.m_data[3] = fmtInfo.lookupBias.m_data[3];
  refParams.super_RenderParams.colorScale.m_data[0] = fmtInfo.lookupScale.m_data[0];
  refParams.super_RenderParams.colorScale.m_data[1] = fmtInfo.lookupScale.m_data[1];
  refParams.super_RenderParams.colorScale.m_data[2] = fmtInfo.lookupScale.m_data[2];
  refParams.super_RenderParams.colorScale.m_data[3] = fmtInfo.lookupScale.m_data[3];
  refParams.lodMode = LODMODE_EXACT;
  (**(code **)(lVar20 + 0xb8))(0x9009,pFVar21->texture->m_glTexture);
  (**(code **)(lVar20 + 0x1360))(0x9009,0x2801,this->m_minFilter);
  (**(code **)(lVar20 + 0x1360))(0x9009,0x2800,this->m_magFilter);
  (**(code **)(lVar20 + 0x1360))(0x9009,0x2802,this->m_wrapS);
  (**(code **)(lVar20 + 0x1360))(0x9009,0x2803,this->m_wrapT);
  (**(code **)(lVar20 + 0x1a00))(viewport.x,viewport.y,viewport.width,viewport.height);
  res.m_data._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar4 = (ostringstream *)(res.m_data + 2);
  std::__cxx11::ostringstream::ostringstream(poVar4);
  local_2d8 = lVar20;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"Coordinates: ",0xd);
  tcu::operator<<((ostream *)poVar4,&pFVar21->bottomLeft);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4," -> ",4);
  tcu::operator<<((ostream *)poVar4,&pFVar21->topRight);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&res,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar4);
  std::ios_base::~ios_base(local_180);
  poVar4 = (ostringstream *)(res.m_data + 2);
  face = CUBEFACE_NEGATIVE_X;
  do {
    tcu::Surface::Surface(&result,viewport.width,viewport.height);
    texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    glu::TextureTestUtil::computeQuadTexCoordCubeArray
              (&texCoord,face,&pFVar21->bottomLeft,&pFVar21->topRight,&pFVar21->layerRange);
    res.m_data._0_8_ = local_328;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(res.m_data + 2));
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)(res.m_data + 2),"Face ",5);
    switch(face) {
    case CUBEFACE_NEGATIVE_X:
      bVar7 = false;
      pcVar14 = "-X";
      break;
    case CUBEFACE_POSITIVE_X:
      bVar7 = false;
      pcVar14 = "+X";
      break;
    case CUBEFACE_NEGATIVE_Y:
      bVar7 = false;
      pcVar14 = "-Y";
      break;
    case CUBEFACE_POSITIVE_Y:
      bVar7 = false;
      pcVar14 = "+Y";
      break;
    case CUBEFACE_NEGATIVE_Z:
      bVar7 = false;
      pcVar14 = "-Z";
      break;
    case CUBEFACE_POSITIVE_Z:
      bVar7 = false;
      pcVar14 = "+Z";
      break;
    default:
      bVar7 = true;
      pcVar14 = (char *)0x0;
    }
    if (bVar7) {
      std::ios::clear((int)(res.m_data + 2) + (int)*(undefined8 *)(res.m_data._8_8_ + -0x18));
    }
    else {
      sVar13 = strlen(pcVar14);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)(res.m_data + 2),pcVar14,sVar13)
      ;
    }
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&res,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)(res.m_data + 2));
    std::ios_base::~ios_base(local_180);
    res.m_data._0_8_ = local_328;
    this_00 = (ostringstream *)(res.m_data + 2);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"Texture coordinates:",0x14);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&res,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base(local_180);
    uVar16 = (long)texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2;
    if (3 < uVar16) {
      lVar20 = 0xc;
      uVar17 = 0;
      do {
        local_310 = *(float *)((long)texCoord.super__Vector_base<float,_std::allocator<float>_>.
                                     _M_impl.super__Vector_impl_data._M_start + lVar20 + -0xc);
        local_314 = *(float *)((long)texCoord.super__Vector_base<float,_std::allocator<float>_>.
                                     _M_impl.super__Vector_impl_data._M_start + lVar20 + -8);
        local_318 = *(float *)((long)texCoord.super__Vector_base<float,_std::allocator<float>_>.
                                     _M_impl.super__Vector_impl_data._M_start + lVar20 + -4);
        local_31c = *(float *)((long)texCoord.super__Vector_base<float,_std::allocator<float>_>.
                                     _M_impl.super__Vector_impl_data._M_start + lVar20);
        res.m_data._0_8_ = local_328;
        std::__cxx11::ostringstream::ostringstream(poVar4);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,": (",3);
        std::ostream::_M_insert<double>((double)local_310);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,", ",2);
        std::ostream::_M_insert<double>((double)local_314);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,", ",2);
        std::ostream::_M_insert<double>((double)local_318);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,", ",2);
        std::ostream::_M_insert<double>((double)local_31c);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,")",1);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&res,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar4);
        std::ios_base::~ios_base(local_180);
        uVar17 = uVar17 + 1;
        lVar20 = lVar20 + 0x10;
      } while (uVar16 >> 2 != uVar17);
    }
    gls::TextureTestUtil::TextureRenderer::renderQuad
              (&this->m_renderer,0,
               texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start,&refParams.super_RenderParams);
    dVar9 = (**(code **)(local_2d8 + 0x800))();
    glu::checkError(dVar9,"Draw",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureFilteringTests.cpp"
                    ,0x173);
    y = viewport.y;
    iVar8 = viewport.x;
    local_378.coordBits.m_data[0] = 8;
    local_378.coordBits.m_data[1] = 3;
    pvVar19 = (void *)result.m_pixels.m_cap;
    if (result.m_pixels.m_cap != 0) {
      pvVar19 = result.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)&res,(TextureFormat *)&local_378,result.m_width,result.m_height,
               1,pvVar19);
    glu::readPixels(local_2e0,iVar8,y,(PixelBufferAccess *)&res);
    dVar9 = (**(code **)(local_2d8 + 0x800))();
    glu::checkError(dVar9,"Read pixels",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureFilteringTests.cpp"
                    ,0x176);
    dVar9 = this->m_minFilter;
    dVar5 = this->m_magFilter;
    iVar8 = (*local_2e0->_vptr_RenderContext[4])();
    pixelFormat._0_8_ = *(undefined8 *)(CONCAT44(extraout_var_00,iVar8) + 8);
    pixelFormat._8_8_ = *(undefined8 *)(CONCAT44(extraout_var_00,iVar8) + 0x10);
    lVar20 = 0;
    do {
      coordBits.m_data[lVar20] = 10;
      lVar20 = lVar20 + 1;
    } while (lVar20 != 4);
    local_378.coordBits.m_data[0] = pixelFormat.redBits;
    local_378.coordBits.m_data[1] = pixelFormat.greenBits;
    local_378.coordBits.m_data[2] = pixelFormat.blueBits;
    local_378.uvwBits.m_data[0] = pixelFormat.alphaBits;
    res.m_data[0] = 0;
    res.m_data[1] = 0;
    res.m_data[2] = 0;
    res.m_data[3] = 0;
    lVar20 = 0;
    do {
      res.m_data[lVar20] =
           local_378.coordBits.m_data[lVar20] + ((dVar5 == 0x2600 && dVar9 == 0x2600) | 0xfffffffe);
      lVar20 = lVar20 + 1;
    } while (lVar20 != 4);
    local_3a8.m_numLevels = 0;
    local_3a8._4_4_ = 0;
    local_3a8.m_levels = (ConstPixelBufferAccess *)0x0;
    colorBits.m_data[0] = 0;
    colorBits.m_data[1] = 0;
    colorBits.m_data[2] = 0;
    colorBits.m_data[3] = 0;
    lVar20 = 0;
    do {
      iVar8 = (&local_3a8.m_numLevels)[lVar20];
      if ((&local_3a8.m_numLevels)[lVar20] < res.m_data[lVar20]) {
        iVar8 = res.m_data[lVar20];
      }
      colorBits.m_data[lVar20] = iVar8;
      lVar20 = lVar20 + 1;
    } while (lVar20 != 4);
    lodPrecision.rule = RULE_OPENGL;
    lVar20 = 0;
    do {
      local_378.coordBits.m_data[lVar20] = 0x16;
      lVar20 = lVar20 + 1;
    } while (lVar20 != 3);
    lVar20 = 3;
    do {
      local_378.coordBits.m_data[lVar20] = 0x10;
      lVar20 = lVar20 + 1;
    } while (lVar20 != 6);
    local_378.colorThreshold.m_data[0] = 0.0;
    local_378.colorThreshold.m_data[1] = 0.0;
    local_378.colorThreshold.m_data[2] = 0.0;
    local_378.colorThreshold.m_data[3] = 0.0;
    local_378.colorMask.m_data[0] = true;
    local_378.colorMask.m_data[1] = true;
    local_378.colorMask.m_data[2] = true;
    local_378.colorMask.m_data[3] = true;
    lodPrecision.derivateBits = 10;
    lodPrecision.lodBits = 5;
    tcu::computeFixedPointThreshold((tcu *)&local_3a8,&colorBits);
    res.m_data[0] = 0;
    res.m_data[1] = 0;
    res.m_data[2] = 0;
    res.m_data[3] = 0;
    lVar20 = 0;
    do {
      res.m_data[lVar20] =
           (int)((float)(&local_3a8.m_numLevels)[lVar20] /
                refParams.super_RenderParams.colorScale.m_data[lVar20]);
      lVar20 = lVar20 + 1;
    } while (lVar20 != 4);
    local_378.colorThreshold.m_data[0] = (float)res.m_data[0];
    local_378.colorThreshold.m_data[1] = (float)res.m_data[1];
    local_378.colorThreshold.m_data[2] = (float)res.m_data[2];
    local_378.colorThreshold.m_data[3] = (float)res.m_data[3];
    local_378.coordBits.m_data[0] = coordBits.m_data[0];
    local_378.coordBits.m_data[1] = coordBits.m_data[1];
    local_378.coordBits.m_data[2] = coordBits.m_data[2];
    lVar20 = 0;
    do {
      res.m_data[lVar20] = 6;
      lVar20 = lVar20 + 1;
    } while (lVar20 != 3);
    local_378.uvwBits.m_data[2] = res.m_data[2];
    local_378.uvwBits.m_data[0] = res.m_data[0];
    local_378.uvwBits.m_data[1] = res.m_data[1];
    local_378.colorMask.m_data[1] = 0 < pixelFormat.greenBits;
    local_378.colorMask.m_data[0] = 0 < pixelFormat.redBits;
    local_378.colorMask.m_data[2] = 0 < pixelFormat.blueBits;
    local_378.colorMask.m_data[3] = 0 < pixelFormat.alphaBits;
    pTVar18 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    local_3a8.m_numLevels = 8;
    local_3a8._4_4_ = 3;
    pvVar19 = (void *)result.m_pixels.m_cap;
    if (result.m_pixels.m_cap != 0) {
      pvVar19 = result.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)&res,(TextureFormat *)&local_3a8,result.m_width,result.m_height,
               1,pvVar19);
    local_3a8.m_levels = (pFVar21->texture->m_refTexture).m_view.m_levels;
    local_3a8.m_numLevels = (pFVar21->texture->m_refTexture).m_view.m_numLevels;
    bVar7 = glu::TextureTestUtil::verifyTextureResult
                      (pTVar18,(ConstPixelBufferAccess *)&res,&local_3a8,
                       texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start,&refParams,&local_378,&coordBits,
                       &lodPrecision,&pixelFormat);
    if (!bVar7) {
      lodPrecision.lodBits = 4;
      lVar20 = 0;
      do {
        res.m_data[lVar20] = 4;
        lVar20 = lVar20 + 1;
      } while (lVar20 != 3);
      local_378.uvwBits.m_data[2] = res.m_data[2];
      local_378.uvwBits.m_data[0] = res.m_data[0];
      local_378.uvwBits.m_data[1] = res.m_data[1];
      res.m_data._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(res.m_data + 2));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(res.m_data + 2),
                 "Warning: Verification against high precision requirements failed, trying with lower requirements."
                 ,0x61);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&res,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)(res.m_data + 2));
      std::ios_base::~ios_base(local_180);
      pTVar18 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
      local_3a8.m_numLevels = 8;
      local_3a8._4_4_ = 3;
      pvVar19 = (void *)result.m_pixels.m_cap;
      if (result.m_pixels.m_cap != 0) {
        pvVar19 = result.m_pixels.m_ptr;
      }
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)&res,(TextureFormat *)&local_3a8,result.m_width,
                 result.m_height,1,pvVar19);
      local_3a8.m_levels = (pFVar21->texture->m_refTexture).m_view.m_levels;
      local_3a8.m_numLevels = (pFVar21->texture->m_refTexture).m_view.m_numLevels;
      bVar7 = glu::TextureTestUtil::verifyTextureResult
                        (pTVar18,(ConstPixelBufferAccess *)&res,&local_3a8,
                         texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start,&refParams,&local_378,&coordBits,
                         &lodPrecision,&pixelFormat);
      if (bVar7) {
        pTVar18 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
        if (pTVar18->m_testResult != QP_TEST_RESULT_PASS) goto LAB_004ab5b7;
        testResult = QP_TEST_RESULT_QUALITY_WARNING;
        pcVar14 = "Low-quality filtering result";
      }
      else {
        res.m_data._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)(res.m_data + 2));
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(res.m_data + 2),
                   "ERROR: Verification against low precision requirements failed, failing test case."
                   ,0x51);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&res,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)(res.m_data + 2));
        std::ios_base::~ios_base(local_180);
        pTVar18 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
        testResult = QP_TEST_RESULT_FAIL;
        pcVar14 = "Image verification failed";
      }
      tcu::TestContext::setTestResult(pTVar18,testResult,pcVar14);
    }
LAB_004ab5b7:
    if (texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    tcu::Surface::~Surface(&result);
    face = face + CUBEFACE_POSITIVE_X;
    if (face == CUBEFACE_LAST) {
      iVar8 = this->m_caseNdx + 1;
      this->m_caseNdx = iVar8;
      pFVar21 = (this->m_cases).
                super__Vector_base<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase,_std::allocator<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pFVar6 = (this->m_cases).
               super__Vector_base<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase,_std::allocator<deqp::gles31::Functional::TextureCubeArrayFilteringCase::FilterCase>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      tcu::TestLog::endSection(section.m_log);
      return (IterateResult)(iVar8 < (int)((ulong)((long)pFVar6 - (long)pFVar21) >> 5));
    }
  } while( true );
}

Assistant:

TextureCubeArrayFilteringCase::IterateResult TextureCubeArrayFilteringCase::iterate (void)
{
	TestLog&						log				= m_testCtx.getLog();
	const glu::RenderContext&		renderCtx		= m_context.getRenderContext();
	const glw::Functions&			gl				= renderCtx.getFunctions();
	const int						viewportSize	= 28;
	const deUint32					randomSeed		= deStringHash(getName()) ^ deInt32Hash(m_caseNdx) ^ m_testCtx.getCommandLine().getBaseSeed();
	const RandomViewport			viewport		(m_context.getRenderTarget(), viewportSize, viewportSize, randomSeed);
	const FilterCase&				curCase			= m_cases[m_caseNdx];
	const tcu::TextureFormat		texFmt			= curCase.texture->getRefTexture().getFormat();
	const tcu::TextureFormatInfo	fmtInfo			= tcu::getTextureFormatInfo(texFmt);
	const tcu::ScopedLogSection		section			(m_testCtx.getLog(), string("Test") + de::toString(m_caseNdx), string("Test ") + de::toString(m_caseNdx));
	ReferenceParams					refParams		(TEXTURETYPE_CUBE_ARRAY);

	if (viewport.width < viewportSize || viewport.height < viewportSize)
		throw tcu::NotSupportedError("Render target too small", "", __FILE__, __LINE__);

	// Params for reference computation.
	refParams.sampler					= glu::mapGLSampler(GL_CLAMP_TO_EDGE, GL_CLAMP_TO_EDGE, m_minFilter, m_magFilter);
	refParams.sampler.seamlessCubeMap	= true;
	refParams.samplerType				= getSamplerType(texFmt);
	refParams.colorBias					= fmtInfo.lookupBias;
	refParams.colorScale				= fmtInfo.lookupScale;
	refParams.lodMode					= LODMODE_EXACT;

	gl.bindTexture	(GL_TEXTURE_CUBE_MAP_ARRAY, curCase.texture->getGLTexture());
	gl.texParameteri(GL_TEXTURE_CUBE_MAP_ARRAY, GL_TEXTURE_MIN_FILTER,	m_minFilter);
	gl.texParameteri(GL_TEXTURE_CUBE_MAP_ARRAY, GL_TEXTURE_MAG_FILTER,	m_magFilter);
	gl.texParameteri(GL_TEXTURE_CUBE_MAP_ARRAY, GL_TEXTURE_WRAP_S,		m_wrapS);
	gl.texParameteri(GL_TEXTURE_CUBE_MAP_ARRAY, GL_TEXTURE_WRAP_T,		m_wrapT);

	gl.viewport(viewport.x, viewport.y, viewport.width, viewport.height);

	m_testCtx.getLog() << TestLog::Message << "Coordinates: " << curCase.bottomLeft << " -> " << curCase.topRight << TestLog::EndMessage;

	for (int faceNdx = 0; faceNdx < tcu::CUBEFACE_LAST; faceNdx++)
	{
		const tcu::CubeFace		face		= tcu::CubeFace(faceNdx);
		tcu::Surface			result		(viewport.width, viewport.height);
		vector<float>			texCoord;

		computeQuadTexCoordCubeArray(texCoord, face, curCase.bottomLeft, curCase.topRight, curCase.layerRange);

		log << TestLog::Message << "Face " << getFaceDesc(face) << TestLog::EndMessage;

		log << TestLog::Message << "Texture coordinates:" << TestLog::EndMessage;

		logCubeArrayTexCoords(log, texCoord);

		m_renderer.renderQuad(0, &texCoord[0], refParams);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Draw");

		glu::readPixels(renderCtx, viewport.x, viewport.y, result.getAccess());
		GLU_EXPECT_NO_ERROR(gl.getError(), "Read pixels");

		{
			const bool				isNearestOnly	= m_minFilter == GL_NEAREST && m_magFilter == GL_NEAREST;
			const tcu::PixelFormat	pixelFormat		= renderCtx.getRenderTarget().getPixelFormat();
			const tcu::IVec4		coordBits		= tcu::IVec4(10);
			const tcu::IVec4		colorBits		= max(getBitsVec(pixelFormat) - (isNearestOnly ? 1 : 2), tcu::IVec4(0)); // 1 inaccurate bit if nearest only, 2 otherwise
			tcu::LodPrecision		lodPrecision	(tcu::LodPrecision::RULE_OPENGL);
			tcu::LookupPrecision	lookupPrecision;

			lodPrecision.derivateBits		= 10;
			lodPrecision.lodBits			= 5;
			lookupPrecision.colorThreshold	= tcu::computeFixedPointThreshold(colorBits) / refParams.colorScale;
			lookupPrecision.coordBits		= coordBits.toWidth<3>();
			lookupPrecision.uvwBits			= tcu::IVec3(6);
			lookupPrecision.colorMask		= getCompareMask(pixelFormat);

			const bool isHighQuality = verifyTextureResult(m_testCtx, result.getAccess(), curCase.texture->getRefTexture(),
														   &texCoord[0], refParams, lookupPrecision, coordBits, lodPrecision, pixelFormat);

			if (!isHighQuality)
			{
				// Evaluate against lower precision requirements.
				lodPrecision.lodBits	= 4;
				lookupPrecision.uvwBits	= tcu::IVec3(4);

				m_testCtx.getLog() << TestLog::Message << "Warning: Verification against high precision requirements failed, trying with lower requirements." << TestLog::EndMessage;

				const bool isOk = verifyTextureResult(m_testCtx, result.getAccess(), curCase.texture->getRefTexture(),
													  &texCoord[0], refParams, lookupPrecision, coordBits, lodPrecision, pixelFormat);

				if (!isOk)
				{
					m_testCtx.getLog() << TestLog::Message << "ERROR: Verification against low precision requirements failed, failing test case." << TestLog::EndMessage;
					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image verification failed");
				}
				else if (m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
					m_testCtx.setTestResult(QP_TEST_RESULT_QUALITY_WARNING, "Low-quality filtering result");
			}
		}
	}

	m_caseNdx += 1;
	return m_caseNdx < (int)m_cases.size() ? CONTINUE : STOP;
}